

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::FeatureSet::~FeatureSet(FeatureSet *this)

{
  ~FeatureSet(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

FeatureSet::~FeatureSet() {
  // @@protoc_insertion_point(destructor:google.protobuf.FeatureSet)
  SharedDtor(*this);
}